

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

void __thiscall Lexer::nextLexem(Lexer *this,ifstream *fin)

{
  byte bVar1;
  char cVar2;
  bool bVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  string *this_00;
  bool local_134;
  allocator local_69;
  string local_68 [32];
  undefined4 local_48;
  string local_38 [8];
  string value;
  ifstream *fin_local;
  Lexer *this_local;
  
  std::__cxx11::string::string(local_38);
  (this->lexem).type = null;
  bVar1 = std::ios::eof();
  if ((bVar1 & 1) == 0) {
    while ((this->lexem).type == null) {
      if ((this->ch == ' ') || (this->ch == '\n')) {
        cVar2 = std::istream::get();
        this->ch = cVar2;
      }
      else {
        bVar3 = inSymbols(this,&this->ch);
        if (bVar3) {
          pmVar4 = std::
                   map<char,_lexemtype,_std::less<char>,_std::allocator<std::pair<const_char,_lexemtype>_>_>
                   ::operator[](&this->SYMBOLS,&this->ch);
          (this->lexem).type = *pmVar4;
          cVar2 = this->ch;
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_68,1,cVar2,&local_69);
          this_00 = &(this->lexem).value;
          std::__cxx11::string::operator=((string *)this_00,local_68);
          std::__cxx11::string::~string(local_68);
          std::allocator<char>::~allocator((allocator<char> *)&local_69);
          std::
          map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
          ::emplace<std::__cxx11::string&,lexemtype&>
                    ((map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                      *)&this->table,this_00,&(this->lexem).type);
          cVar2 = std::istream::get();
          this->ch = cVar2;
        }
        else {
          bVar3 = isDigit(this,&this->ch);
          if (bVar3) {
            std::__cxx11::string::operator=(local_38,"");
            while (bVar3 = isDigit(this,&this->ch), bVar3) {
              std::__cxx11::string::operator+=(local_38,this->ch);
              cVar2 = std::istream::get();
              this->ch = cVar2;
            }
            (this->lexem).type = INTLITERAL;
            std::__cxx11::string::operator=((string *)&(this->lexem).value,local_38);
            std::
            map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
            ::emplace<std::__cxx11::string&,lexemtype&>
                      ((map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                        *)&this->table,&(this->lexem).value,&(this->lexem).type);
          }
          else {
            bVar3 = isAlfa(this,&this->ch);
            if (bVar3) {
              std::__cxx11::string::operator=(local_38,"");
              while( true ) {
                bVar3 = isAlfa(this,&this->ch);
                local_134 = true;
                if (!bVar3) {
                  local_134 = isDigit(this,&this->ch);
                }
                if (local_134 == false) break;
                std::__cxx11::string::operator+=(local_38,this->ch);
                cVar2 = std::istream::get();
                this->ch = cVar2;
              }
              bVar3 = inKeywords(this,(string *)local_38);
              if (bVar3) {
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
                         ::operator[](&this->KEYWORDS,(key_type *)local_38);
                (this->lexem).type = *pmVar5;
                std::__cxx11::string::operator=((string *)&(this->lexem).value,local_38);
                std::
                map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                ::emplace<std::__cxx11::string&,lexemtype&>
                          ((map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                            *)&this->table,&(this->lexem).value,&(this->lexem).type);
              }
              else {
                bVar3 = inDataTypes(this,(string *)local_38);
                if (bVar3) {
                  pmVar5 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lexemtype>_>_>
                           ::operator[](&this->DATA_TYPES,(key_type *)local_38);
                  (this->lexem).type = *pmVar5;
                  std::__cxx11::string::operator=((string *)&(this->lexem).value,local_38);
                  std::
                  map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                  ::emplace<std::__cxx11::string&,lexemtype&>
                            ((map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                              *)&this->table,&(this->lexem).value,&(this->lexem).type);
                }
                else {
                  (this->lexem).type = IDENTIFIER;
                  std::__cxx11::string::operator=((string *)&(this->lexem).value,local_38);
                  std::
                  map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                  ::emplace<std::__cxx11::string&,lexemtype&>
                            ((map<std::__cxx11::string,lexemtype,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,lexemtype>>>
                              *)&this->table,&(this->lexem).value,&(this->lexem).type);
                }
              }
            }
          }
        }
      }
    }
    local_48 = 0;
  }
  else {
    (this->lexem).type = null;
    local_48 = 1;
  }
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void Lexer::nextLexem(ifstream &fin) {
    string value;
    lexem.type = null;
    if (fin.eof()) {
        lexem.type = null;
        return;
    }
    while(lexem.type == null) {
        if (ch == ' ' || ch == '\n') {
            ch = fin.get();
            continue;
        }
        if (inSymbols(ch)) {
            lexem.type = SYMBOLS[ch];
            lexem.value = string(1,  ch);
            table.emplace(lexem.value, lexem.type);
            ch = fin.get();
            continue;
        }
        if (isDigit(ch)) {
            value = "";
            while (isDigit(ch)) {
                value += ch;
                ch = fin.get();
            }
            lexem.type = INTLITERAL;
            lexem.value = value;
            table.emplace(lexem.value, lexem.type);
            continue;
        }
        if (isAlfa(ch)) {
            value = "";
            while (isAlfa(ch) || isDigit(ch)) {
                value += ch;
                ch = fin.get();
            }
            if (inKeywords(value)) {
                lexem.type = KEYWORDS[value];
                lexem.value = value;
                table.emplace(lexem.value, lexem.type);
                continue;
            }
            if (inDataTypes(value)) {
                lexem.type = DATA_TYPES[value];
                lexem.value = value;
                table.emplace(lexem.value, lexem.type);
                continue;
            }
            lexem.type = IDENTIFIER;
            lexem.value = value;
            table.emplace(lexem.value, lexem.type);
        }
    }
}